

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4db70::logical_combination<((anonymous_namespace)::logical_combination_types)2>::
validate(logical_combination<((anonymous_namespace)::logical_combination_types)2> *this,
        json_pointer *ptr,json *instance,json_patch *patch,error_handler *e)

{
  pointer psVar1;
  long *plVar2;
  size_type __new_size;
  vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *this_00;
  bool bVar3;
  ulong __val;
  long lStack_120;
  long local_110;
  logical_combination_error_handler esub;
  long local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  logical_combination_error_handler error_summary;
  
  error_summary.super_error_handler._vptr_error_handler =
       (_func_int **)&PTR__logical_combination_error_handler_001548d8;
  error_summary.error_entry_list_.
  super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  error_summary.error_entry_list_.
  super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  error_summary.error_entry_list_.
  super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8 = 0;
  __val = 0;
  local_110 = 0;
  do {
    psVar1 = (this->subschemata_).
             super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->subschemata_).
                      super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= __val) {
      if (local_110 == 0) {
        std::operator+(&local_70,
                       "no subschema has succeeded, but one of them is required to validate. Type: "
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (anonymous_namespace)::
                        logical_combination<((anonymous_namespace)::logical_combination_types)2>::
                        key_abi_cxx11_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&esub,
                       &local_70,", number of failed subschemas: ");
        std::__cxx11::to_string
                  (&local_90,
                   (long)(this->subschemata_).
                         super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->subschemata_).
                         super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4);
        std::operator+(&local_b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&esub,
                       &local_90);
        (*e->_vptr_error_handler[2])(e,ptr,instance,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&esub);
        std::__cxx11::string::~string((string *)&local_70);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&esub,
                       "[combination: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (anonymous_namespace)::
                       logical_combination<((anonymous_namespace)::logical_combination_types)2>::
                       key_abi_cxx11_);
        std::operator+(&local_b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&esub,
                       " / ");
        logical_combination_error_handler::propagate(&error_summary,e,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&esub);
      }
      break;
    }
    esub.super_error_handler._vptr_error_handler =
         (_func_int **)&PTR__logical_combination_error_handler_001548d8;
    esub.error_entry_list_.
    super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    esub.error_entry_list_.
    super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    esub.error_entry_list_.
    super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __new_size = nlohmann::json_abi_v3_11_2::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::size(&patch->j_);
    plVar2 = *(long **)((long)&(psVar1->
                               super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + local_b8);
    (**(code **)(*plVar2 + 0x18))(plVar2,ptr,instance,patch,&esub);
    if (esub.error_entry_list_.
        super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        esub.error_entry_list_.
        super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (local_110 == 0) {
        lStack_120 = 1;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,
                   "more than one subschema has succeeded, but exactly one of them is required to validate"
                   ,(allocator<char> *)&local_70);
        (*e->_vptr_error_handler[2])(e,ptr,instance,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        lStack_120 = 2;
      }
      bVar3 = local_110 != 0;
      local_110 = lStack_120;
    }
    else {
      this_00 = nlohmann::json_abi_v3_11_2::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::
                get_ref_impl<std::vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          (&patch->j_);
      std::
      vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::resize(this_00,__new_size);
      std::__cxx11::to_string(&local_90,__val);
      std::operator+(&local_70,"case#",&local_90);
      std::operator+(&local_b0,&local_70,"] ");
      logical_combination_error_handler::propagate
                (&esub,&error_summary.super_error_handler,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      bVar3 = false;
    }
    logical_combination_error_handler::~logical_combination_error_handler(&esub);
    __val = __val + 1;
    local_b8 = local_b8 + 0x10;
  } while (!bVar3);
  logical_combination_error_handler::~logical_combination_error_handler(&error_summary);
  return;
}

Assistant:

void validate(const json::json_pointer &ptr, const json &instance, json_patch &patch, error_handler &e) const final
	{
		size_t count = 0;
		logical_combination_error_handler error_summary;

		for (std::size_t index = 0; index < subschemata_.size(); ++index) {
			const std::shared_ptr<schema> &s = subschemata_[index];
			logical_combination_error_handler esub;
			auto oldPatchSize = patch.get_json().size();
			s->validate(ptr, instance, patch, esub);
			if (!esub)
				count++;
			else {
				patch.get_json().get_ref<nlohmann::json::array_t &>().resize(oldPatchSize);
				esub.propagate(error_summary, "case#" + std::to_string(index) + "] ");
			}

			if (is_validate_complete(instance, ptr, e, esub, count, index))
				return;
		}

		if (count == 0) {
			e.error(ptr, instance, "no subschema has succeeded, but one of them is required to validate. Type: " + key + ", number of failed subschemas: " + std::to_string(subschemata_.size()));
			error_summary.propagate(e, "[combination: " + key + " / ");
		}
	}